

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comparator.cc
# Opt level: O0

void __thiscall
leveldb::anon_unknown_2::BytewiseComparatorImpl::FindShortSuccessor
          (BytewiseComparatorImpl *this,string *key)

{
  char cVar1;
  ulong uVar2;
  char *pcVar3;
  ulong in_RSI;
  uint8_t byte;
  size_t i;
  size_t n;
  ulong local_20;
  
  uVar2 = std::__cxx11::string::size();
  local_20 = 0;
  while( true ) {
    if (uVar2 <= local_20) {
      return;
    }
    pcVar3 = (char *)std::__cxx11::string::operator[](in_RSI);
    cVar1 = *pcVar3;
    if (cVar1 != -1) break;
    local_20 = local_20 + 1;
  }
  pcVar3 = (char *)std::__cxx11::string::operator[](in_RSI);
  *pcVar3 = cVar1 + '\x01';
  std::__cxx11::string::resize(in_RSI);
  return;
}

Assistant:

void FindShortSuccessor(std::string* key) const override {
    // Find first character that can be incremented
    size_t n = key->size();
    for (size_t i = 0; i < n; i++) {
      const uint8_t byte = (*key)[i];
      if (byte != static_cast<uint8_t>(0xff)) {
        (*key)[i] = byte + 1;
        key->resize(i + 1);
        return;
      }
    }
    // *key is a run of 0xffs.  Leave it alone.
  }